

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestParser.cpp
# Opt level: O1

void __thiscall UnitTest_parser1::Run(UnitTest_parser1 *this)

{
  long *plVar1;
  int iVar2;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined4 local_30;
  long *local_28;
  
  local_48.str_ = (String *)&local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "a = -123 ^ 2 ^ -2 * 1 / 2 % 2 * 2 ^ 10 + 10 - 5 .. \'str\' == \'str\' and true or false"
             ,"");
  io::text::InStringStream::SetInputString
            ((InStringStream *)(anonymous_namespace)::g_parser,(string *)&local_48);
  luna::Parse((luna *)&local_28,(Lexer *)((anonymous_namespace)::g_parser + 0xd0));
  plVar1 = local_28;
  if (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 8))(local_28);
  }
  local_28 = (long *)0x0;
  if (local_48.str_ != (String *)&local_38) {
    operator_delete(local_48.str_);
  }
  if (plVar1 == (long *)0x0) {
    local_48.str_ = (String *)&local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,
               "\'Parse(\"a = -123 ^ 2 ^ -2 * 1 / 2 % 2 * 2 ^ 10 + 10 - 5 .. \'str\' == \'str\' and true or false\")\'"
               ,"");
    UnitTestBase::Error(&this->super_UnitTestBase,(string *)&local_48);
    if (local_48.str_ != (String *)&local_38) {
      operator_delete(local_48.str_);
    }
  }
  local_48.number_ = 0.0;
  uStack_40 = 0;
  local_38 = 0;
  local_30 = 0x11e;
  iVar2 = luna::Lexer::GetToken
                    ((Lexer *)((anonymous_namespace)::g_parser + 0xd0),(TokenDetail *)&local_48);
  if (iVar2 != 0x11e) {
    local_48.str_ = (String *)&local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"\'IsEOF()\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,(string *)&local_48);
    if (local_48.str_ != (String *)&local_38) {
      operator_delete(local_48.str_);
    }
  }
  return;
}

Assistant:

TEST_CASE(parser1)
{
    EXPECT_TRUE(Parse("a = -123 ^ 2 ^ -2 * 1 / 2 % 2 * 2 ^ 10 + 10 - 5 .. 'str' == 'str' and true or false"));
    EXPECT_TRUE(IsEOF());
}